

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::reject
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this,
          Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<siginfo_t> local_238;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<siginfo_t>::ExceptionOr(&local_238,false,exception_00);
    ExceptionOr<siginfo_t>::operator=(&this->result,&local_238);
    ExceptionOr<siginfo_t>::~ExceptionOr(&local_238);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }